

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Printer *printer,Options *options)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  ulong uVar4;
  pointer ppVar5;
  _Self local_88;
  const_iterator end_2;
  const_iterator it_2;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Self local_40;
  const_iterator end_1;
  const_iterator it_1;
  const_iterator end;
  const_iterator it;
  Options *options_local;
  Printer *printer_local;
  ForwardDeclarations *this_local;
  
  end = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
        ::begin(&this->enums_);
  it_1._M_node = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
                 ::end(&this->enums_);
  while (bVar1 = std::operator!=(&end,(_Self *)&it_1), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>
             ::operator->(&end);
    io::Printer::Print(printer,"enum $enumname$ : int;\n","enumname",&ppVar2->first);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>
             ::operator->(&end);
    io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"enumname",ppVar2->second);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>
             ::operator->(&end);
    io::Printer::Print(printer,"bool $enumname$_IsValid(int value);\n","enumname",&ppVar2->first);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>
    ::operator++(&end);
  }
  end_1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
          ::begin(&this->classes_);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
       ::end(&this->classes_);
  while (bVar1 = std::operator!=(&end_1,&local_40), bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
             ::operator->(&end_1);
    io::Printer::Print(printer,"class $classname$;\n","classname",&ppVar3->first);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
             ::operator->(&end_1);
    io::Printer::Annotate<google::protobuf::Descriptor>(printer,"classname",ppVar3->second);
    uVar4 = std::__cxx11::string::empty();
    bVar1 = (uVar4 & 1) != 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    }
    else {
      std::operator+(&local_60,&options->dllexport_decl," ");
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
             ::operator->(&end_1);
    io::Printer::Print(printer,
                       "class $classname$DefaultTypeInternal;\n$dllexport_decl$extern $classname$DefaultTypeInternal _$classname$_default_instance_;\n"
                       ,"dllexport_decl",&local_60,"classname",&ppVar3->first);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::allocator<char>::~allocator(&local_61);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
    ::operator++(&end_1);
  }
  end_2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>_>
          ::begin(&this->namespaces_);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>_>
       ::end(&this->namespaces_);
  while (bVar1 = std::operator!=(&end_2,&local_88), bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>
             ::operator->(&end_2);
    io::Printer::Print(printer,"namespace $nsname$ {\n","nsname",&ppVar5->first);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>
             ::operator->(&end_2);
    Print(ppVar5->second,printer,options);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>
             ::operator->(&end_2);
    io::Printer::Print(printer,"}  // namespace $nsname$\n","nsname",&ppVar5->first);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>
    ::operator++(&end_2);
  }
  return;
}

Assistant:

void Print(io::Printer* printer, const Options& options) const {
    for (std::map<string, const EnumDescriptor *>::const_iterator
             it = enums_.begin(),
             end = enums_.end();
         it != end; ++it) {
      printer->Print("enum $enumname$ : int;\n", "enumname", it->first);
      printer->Annotate("enumname", it->second);
      printer->Print("bool $enumname$_IsValid(int value);\n", "enumname",
                     it->first);
    }
    for (std::map<string, const Descriptor*>::const_iterator
             it = classes_.begin(),
             end = classes_.end();
         it != end; ++it) {
      printer->Print("class $classname$;\n", "classname", it->first);
      printer->Annotate("classname", it->second);

      printer->Print(
          "class $classname$DefaultTypeInternal;\n"
          "$dllexport_decl$"
          "extern $classname$DefaultTypeInternal "
          "_$classname$_default_instance_;\n",  // NOLINT
          "dllexport_decl",
          options.dllexport_decl.empty() ? "" : options.dllexport_decl + " ",
          "classname",
          it->first);
    }
    for (std::map<string, ForwardDeclarations *>::const_iterator
             it = namespaces_.begin(),
             end = namespaces_.end();
         it != end; ++it) {
      printer->Print("namespace $nsname$ {\n",
                     "nsname", it->first);
      it->second->Print(printer, options);
      printer->Print("}  // namespace $nsname$\n",
                     "nsname", it->first);
    }
  }